

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<cs::struct_builder_const&,cs::type_id_const&>
          (holder<cs::type_t> *this,struct_builder *args,type_id *args_1)

{
  size_t sVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0024dd58;
  std::function<cs_impl::any()>::function<cs::struct_builder_const&,void>
            ((function<cs_impl::any()> *)&local_38,args);
  *(undefined8 *)&(this->mDat).constructor.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDat).constructor.super__Function_base._M_functor + 8) = 0;
  (this->mDat).constructor.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDat).constructor._M_invoker = local_20;
  if (local_28 != (_Manager_type)0x0) {
    *(undefined8 *)&(this->mDat).constructor.super__Function_base._M_functor = local_38;
    *(undefined8 *)((long)&(this->mDat).constructor.super__Function_base._M_functor + 8) = uStack_30
    ;
    (this->mDat).constructor.super__Function_base._M_manager = local_28;
  }
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar1 = args_1->type_hash;
  (this->mDat).id.type_idx._M_target = (args_1->type_idx)._M_target;
  (this->mDat).id.type_hash = sVar1;
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}